

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O3

string * __thiscall
duckdb::QueryProfiler::GetSaveLocation_abi_cxx11_
          (string *__return_storage_ptr__,QueryProfiler *this)

{
  ClientContext *pCVar1;
  pointer pcVar2;
  
  if (this->is_explain_analyze == true) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pCVar1 = this->context;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pCVar1->config).profiler_save_location._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (pCVar1->config).profiler_save_location._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

string QueryProfiler::GetSaveLocation() const {
	return is_explain_analyze ? string() : ClientConfig::GetConfig(context).profiler_save_location;
}